

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackLog.cxx
# Opt level: O0

void __thiscall cmCPackLog::cmCPackLog(cmCPackLog *this)

{
  cmCPackLog *this_local;
  
  cmObject::cmObject(&this->super_cmObject);
  (this->super_cmObject)._vptr_cmObject = (_func_int **)&PTR__cmCPackLog_00aef430;
  std::__cxx11::string::string((string *)&this->Prefix);
  std::__cxx11::string::string((string *)&this->OutputPrefix);
  std::__cxx11::string::string((string *)&this->VerbosePrefix);
  std::__cxx11::string::string((string *)&this->DebugPrefix);
  std::__cxx11::string::string((string *)&this->WarningPrefix);
  std::__cxx11::string::string((string *)&this->ErrorPrefix);
  std::__cxx11::string::string((string *)&this->LogOutputFileName);
  this->Verbose = false;
  this->Debug = false;
  this->Quiet = false;
  this->NewLine = true;
  this->LastTag = 0;
  this->DefaultOutput = (ostream *)&std::cout;
  this->DefaultError = (ostream *)&std::cerr;
  this->LogOutput = (ostream *)0x0;
  this->LogOutputCleanup = false;
  return;
}

Assistant:

cmCPackLog::cmCPackLog()
{
  this->Verbose = false;
  this->Debug = false;
  this->Quiet = false;
  this->NewLine = true;

  this->LastTag = cmCPackLog::NOTAG;
#undef cerr
#undef cout
  this->DefaultOutput = &std::cout;
  this->DefaultError = &std::cerr;

  this->LogOutput = 0;
  this->LogOutputCleanup = false;
}